

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<char_const*const&,char_const(&)[2],unsigned_int_const&,char_const(&)[2],unsigned_int_const&,char_const(&)[5],char_const*const&>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],uint *params_2
          ,char (*params_3) [2],uint *params_4,char (*params_5) [5],char **params_6)

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff48;
  char *local_b0;
  size_t local_a8;
  CappedArray<char,_14UL> local_a0;
  ArrayPtr<const_char> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  pcVar1 = *(char **)this;
  local_a8 = strlen(pcVar1);
  local_b0 = pcVar1;
  local_58.size_ = strlen((char *)params);
  local_58.ptr = (char *)params;
  _::Stringifier::operator*(&local_a0,(Stringifier *)&_::STR,*(uint *)params_1);
  local_68._8_8_ = strlen((char *)params_2);
  local_68._0_8_ = params_2;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_3);
  local_78._8_8_ = strlen((char *)params_4);
  local_78._0_8_ = params_4;
  pcVar1 = *(char **)params_5;
  local_88.size_ = strlen(pcVar1);
  local_88.ptr = pcVar1;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_b0,&local_58,(ArrayPtr<const_char> *)&local_a0,
             (CappedArray<char,_14UL> *)local_68,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)local_78,&local_88,in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}